

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplace_back<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
           *this,span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                 *args)

{
  size_type sVar1;
  reference psVar2;
  pointer psVar3;
  
  psVar3 = (pointer)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    psVar3 = emplaceRealloc<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                       (this,psVar3,args);
    return psVar3;
  }
  sVar1 = args->size_;
  psVar3->data_ = args->data_;
  psVar3->size_ = sVar1;
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  psVar2 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           ::back((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                   *)this);
  return psVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }